

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clmul_1byte.cpp
# Opt level: O1

Sketch * ConstructClMul1Byte(int bits,int implementation)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (Sketch *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

Sketch* ConstructClMul1Byte(int bits, int implementation) {
    switch (bits) {
#ifdef ENABLE_FIELD_INT_5
    case 5: return new SketchImpl<Field5>(implementation, 5);
#endif
#ifdef ENABLE_FIELD_INT_8
    case 8: return new SketchImpl<Field8>(implementation, 8);
#endif
    }
    return nullptr;
}